

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O1

tuple<arma::Col<double>,_arma::Col<double>_> * __thiscall
Kriging::leaveOneOutVec
          (tuple<arma::Col<double>,_arma::Col<double>_> *__return_storage_ptr__,Kriging *this,
          vec *_theta)

{
  uword uVar1;
  uint extraout_EAX;
  uint uVar2;
  void *pvVar3;
  char (*x) [39];
  mat yhat;
  KModel m;
  char *local_658 [201];
  
  uVar1 = (this->m_y).super_Mat<double>.n_elem;
  uVar2 = uVar1 * 2;
  if ((int)uVar1 < 0) {
    local_658[0] = "Mat::init(): requested size is too large; suggest to enable ARMA_64BIT_WORD";
    arma::arma_stop_logic_error<char_const*>((arma *)local_658,(char **)this);
    uVar2 = extraout_EAX;
  }
  if (0x10 < uVar2) {
    x = (char (*) [39])((ulong)uVar2 << 3);
    pvVar3 = lkalloc::malloc((size_t)x);
    if (pvVar3 == (void *)0x0) {
      arma::arma_stop_bad_alloc<char[39]>(x);
    }
  }
  make_Model((KModel *)local_658,this,_theta,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)0x0);
}

Assistant:

LIBKRIGING_EXPORT std::tuple<arma::vec, arma::vec> Kriging::leaveOneOutVec(const arma::vec& _theta) {
  double loo = -1;
  arma::mat yhat = arma::mat(m_y.n_elem, 2, arma::fill::none);
  loo = _leaveOneOut(_theta, nullptr, &yhat, nullptr, nullptr);

  return std::make_tuple(std::move(yhat.col(0)), std::move(yhat.col(1) * std::sqrt(m_sigma2)));
}